

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

string * __thiscall
leveldb::Reverse_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Slice *key)

{
  string *extraout_RAX;
  undefined1 *puVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  string str;
  undefined1 *local_38;
  string *local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,this + (long)&key->data_)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (local_30 != (string *)0x0) {
    puVar1 = local_38 + (long)local_30;
    do {
      puVar1 = puVar1 + -1;
      local_30 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while (puVar1 != local_38);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
    local_30 = extraout_RAX;
  }
  return local_30;
}

Assistant:

static std::string Reverse(const Slice& key) {
  std::string str(key.ToString());
  std::string rev("");
  for (std::string::reverse_iterator rit = str.rbegin(); rit != str.rend();
       ++rit) {
    rev.push_back(*rit);
  }
  return rev;
}